

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromIstream(MessageLite *this,istream *input)

{
  bool bVar1;
  byte local_89;
  undefined1 local_68 [8];
  IstreamInputStream zero_copy_input;
  istream *input_local;
  MessageLite *this_local;
  
  zero_copy_input.impl_._48_8_ = input;
  io::IstreamInputStream::IstreamInputStream((IstreamInputStream *)local_68,input,-1);
  bVar1 = ParsePartialFromZeroCopyStream(this,(ZeroCopyInputStream *)local_68);
  local_89 = 0;
  if (bVar1) {
    local_89 = std::ios::eof();
  }
  io::IstreamInputStream::~IstreamInputStream((IstreamInputStream *)local_68);
  return (bool)(local_89 & 1);
}

Assistant:

bool MessageLite::ParsePartialFromIstream(std::istream* input) {
  io::IstreamInputStream zero_copy_input(input);
  return ParsePartialFromZeroCopyStream(&zero_copy_input) && input->eof();
}